

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_c_zpbeint.c
# Opt level: O3

void gga_c_zpbeint_init(xc_func_type *p)

{
  uint uVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined4 *puVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long extraout_RDX;
  long lVar11;
  long in_RSI;
  long *plVar12;
  long *in_R8;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dStack_e8;
  
  plVar12 = (long *)0x10;
  puVar7 = (undefined4 *)malloc(0x10);
  p->params = puVar7;
  uVar1 = p->info->number;
  uVar9 = (ulong)uVar1;
  if (uVar1 == 0x3d) {
    uVar13 = 0x76c8b439;
    uVar14 = 0x3faa9fbe;
    uVar15 = 0x40033333;
  }
  else {
    if (uVar1 != 0x3f) {
      gga_c_zpbeint_init_cold_1();
      if (in_RSI != 0) {
        lVar11 = 0;
        do {
          lVar8 = (int)plVar12[9] * lVar11;
          dVar16 = *(double *)(extraout_RDX + lVar8 * 8);
          if ((int)plVar12[1] == 2) {
            dVar16 = dVar16 + *(double *)(extraout_RDX + 8 + lVar8 * 8);
          }
          dVar21 = (double)plVar12[0x30];
          if (dVar21 <= dVar16) {
            dVar16 = *(double *)(extraout_RDX + lVar8 * 8);
            uVar13 = SUB84(dVar16,0);
            uVar14 = (undefined4)((ulong)dVar16 >> 0x20);
            if (dVar16 <= dVar21) {
              uVar13 = SUB84(dVar21,0);
              uVar14 = (undefined4)((ulong)dVar21 >> 0x20);
            }
            dVar19 = (double)CONCAT44(uVar14,uVar13);
            dVar16 = (double)plVar12[0x32];
            dVar21 = *(double *)(uVar9 + *(int *)((long)plVar12 + 0x4c) * lVar11 * 8);
            pdVar2 = (double *)plVar12[0x2f];
            dVar3 = cbrt(0.3183098861837907);
            dVar4 = cbrt(dVar19);
            dVar17 = (dVar3 * 1.4422495703074083 * 2.519842099789747) / dVar4;
            dVar22 = SQRT(dVar17);
            dStack_e8 = dVar22;
            if (dVar17 < 0.0) {
              dStack_e8 = sqrt(dVar17);
            }
            dVar16 = dVar16 * dVar16;
            if (dVar17 < 0.0) {
              dVar22 = sqrt(dVar17);
            }
            if (dVar21 <= dVar16) {
              dVar21 = dVar16;
            }
            dVar23 = (dVar3 * dVar3 * 2.080083823051904 * 1.5874010519681996) / (dVar4 * dVar4);
            dVar5 = log(16.081979498692537 /
                        (dVar23 * 0.123235 +
                        dVar22 * dVar17 * 0.204775 + dStack_e8 * 3.79785 + dVar17 * 0.8969) + 1.0);
            dVar16 = (double)plVar12[0x31];
            dVar6 = cbrt(dVar16);
            if (1.0 <= dVar16) {
              dVar18 = dVar16 * dVar6;
            }
            else {
              dVar18 = 1.0;
            }
            dVar22 = log(29.608749977793437 /
                         (dVar23 * 0.1241775 +
                         dVar22 * dVar17 * 0.1100325 + dStack_e8 * 5.1785 + dVar17 * 0.905775) + 1.0
                        );
            dVar16 = (double)(-(ulong)(1.0 <= dVar16) & (ulong)(dVar6 * dVar6) |
                             (ulong)(~(uint)(-(ulong)(1.0 <= dVar16) >> 0x20) & 0x3ff00000) << 0x20)
            ;
            if (dVar21 < 0.0) {
              dVar6 = sqrt(dVar21);
            }
            else {
              dVar6 = SQRT(dVar21);
            }
            dVar19 = dVar19 * dVar19;
            dVar23 = dVar16 * dVar16;
            dVar20 = 1.0 / (dVar16 * dVar23);
            dVar6 = pow(dVar16,(1.0 / (dVar19 * dVar19)) * dVar6 * dVar21 * pdVar2[1] * dVar20 *
                               ((1.0 / dStack_e8) / dVar17) * 0.0625);
            dVar17 = ((dVar18 + dVar18 + -2.0) / 0.5198420997897464) * 0.0197516734986138 *
                     (dVar17 * 0.0278125 + 1.0) * dVar22 +
                     dVar5 * (dVar17 * 0.053425 + 1.0) * -0.0621814;
            dVar22 = *pdVar2;
            dVar5 = exp(dVar17 * -3.258891353270929 * 9.869604401089358 * dVar20);
            dVar22 = (1.0 / (dVar5 + -1.0)) * 9.869604401089358 * dVar22 * 3.258891353270929;
            dVar21 = ((1.0 / (dVar3 * dVar3)) * 1.4422495703074083 * 2.519842099789747 *
                      (1.0 / (dVar23 * dVar23)) *
                      ((1.0 / (dVar4 * dVar4)) / (dVar19 * dVar19)) * 1.5874010519681996 *
                     dVar21 * dVar21 * dVar22) / 3072.0 +
                     (((1.0 / dVar4) / dVar19) * dVar21 * 1.2599210498948732 *
                     (1.0 / dVar23) * 2.080083823051904 * (1.0 / dVar3) * 1.5874010519681996) / 96.0
            ;
            dVar21 = log((1.0 / (dVar22 * dVar21 + 1.0)) * 32.163968442914815 * dVar21 * *pdVar2 +
                         1.0);
            lVar8 = *in_R8;
            if ((lVar8 != 0) && ((*(byte *)(*plVar12 + 0x40) & 1) != 0)) {
              lVar10 = (int)plVar12[0xb] * lVar11;
              *(double *)(lVar8 + lVar10 * 8) =
                   dVar17 + dVar16 * dVar23 * 0.10132118364233778 * dVar6 * 0.3068528194400547 *
                            dVar21 + *(double *)(lVar8 + lVar10 * 8);
            }
          }
          lVar11 = lVar11 + 1;
        } while (in_RSI != lVar11);
      }
      return;
    }
    uVar13 = 0xdf3b645a;
    uVar14 = 0x3fa78d4f;
    uVar15 = 0x40133333;
  }
  *puVar7 = uVar13;
  puVar7[1] = uVar14;
  puVar7[2] = 0x33333333;
  puVar7[3] = uVar15;
  return;
}

Assistant:

static void
gga_c_zpbeint_init(xc_func_type *p)
{
  gga_c_zpbeint_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_c_zpbeint_params));
  params = (gga_c_zpbeint_params *) (p->params);

  switch(p->info->number){
  case XC_GGA_C_ZPBEINT:
    params->beta  = 0.052;
    params->alpha = 2.4;
    break;
  case XC_GGA_C_ZPBESOL:
    params->beta  = 0.046;
    params->alpha = 4.8;
    break;
  default:
    fprintf(stderr, "Internal error in gga_c_zpbeint\n");
    exit(1);
  }
}